

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenerContainerTest.cpp
# Opt level: O2

int main(void)

{
  Foo *this;
  Cat *listener;
  int i_1;
  int x;
  int i;
  long lVar1;
  int i_2;
  ulong uVar2;
  Cat *kittens [4];
  
  this = (Foo *)operator_new(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                             ,0x83);
  Foo::Foo(this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    listener = (Cat *)operator_new(0x10,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                                   ,0x87);
    (listener->super_FooListener)._vptr_FooListener = (_func_int **)&PTR_onFoo_00104ce0;
    listener->mValue = (int)lVar1;
    kittens[lVar1] = listener;
    Foo::addListener(this,(FooListener *)listener);
  }
  getchar();
  for (x = 10; x != 0xe; x = x + 1) {
    Foo::DoFoo(this,x);
  }
  getchar();
  Foo::DoBar(this);
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    if ((uVar2 & 1) == 0) {
      Foo::removeListener(this,&kittens[uVar2]->super_FooListener);
    }
  }
  getchar();
  Foo::DoFoo(this,10);
  getchar();
  Foo::DoBar(this);
  return 0;
}

Assistant:

int main()
{
	Cat *kittens[4];
	Foo *foo = jh_new Foo();
	
	for (int i = 0; i < 4; ++i)
	{
		kittens[i] = jh_new Cat(i);
		foo->addListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 14; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();

	LOG_NOTICE("Remove some listeners");
	for (int i = 0; i < 4; ++i)
	{
		if (i%2 == 0)
			foo->removeListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 11; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();
}